

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qformlayout.cpp
# Opt level: O1

void QFormLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<Qt::AlignmentFlag> *pQVar1;
  uint *puVar2;
  QFlagsStorage<Qt::AlignmentFlag> QVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  PixelMetric pm;
  
  if (_c == ResetProperty) {
    switch(_id) {
    case 0:
      *(uint *)(*(long *)(_o + 8) + 0xb0) = *(uint *)(*(long *)(_o + 8) + 0xb0) | 0xff;
      return;
    case 1:
      *(uint *)(*(long *)(_o + 8) + 0xb0) = *(uint *)(*(long *)(_o + 8) + 0xb0) | 0xff00;
      return;
    case 2:
      *(undefined4 *)(*(long *)(_o + 8) + 0xb4) = 0;
      return;
    case 3:
      *(undefined4 *)(*(long *)(_o + 8) + 0xb8) = 0;
      return;
    default:
      return;
    }
  }
  if (_c != WriteProperty) {
    if (_c != ReadProperty) {
      return;
    }
    if (5 < (uint)_id) {
      return;
    }
    pQVar1 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
    switch(_id) {
    case 0:
      QVar3.i = fieldGrowthPolicy((QFormLayout *)_o);
      break;
    case 1:
      QVar3.i = rowWrapPolicy((QFormLayout *)_o);
      break;
    case 2:
      QVar3.i = (Int)labelAlignment((QFormLayout *)_o);
      break;
    case 3:
      QVar3.i = (Int)formAlignment((QFormLayout *)_o);
      break;
    case 4:
      QVar3.i = *(FieldGrowthPolicy *)(*(long *)(_o + 8) + 0x160);
      if (-1 < (int)QVar3.i) break;
      pm = PM_LayoutHorizontalSpacing;
      goto LAB_003a2c82;
    case 5:
      QVar3.i = *(FieldGrowthPolicy *)(*(long *)(_o + 8) + 0x164);
      if (-1 < (int)QVar3.i) break;
      pm = PM_LayoutVerticalSpacing;
LAB_003a2c82:
      QVar3.i = qSmartSpacing((QLayout *)_o,pm);
    }
    pQVar1->i = QVar3.i;
    return;
  }
  if (5 < (uint)_id) {
    return;
  }
  puVar2 = (uint *)*_a;
  switch(_id) {
  case 0:
    lVar4 = *(long *)(_o + 8);
    if ((*(uint *)(lVar4 + 0xb0) & 0xff) == *puVar2) {
      return;
    }
    uVar6 = *puVar2 & 0xff;
    uVar5 = *(uint *)(lVar4 + 0xb0) & 0xffffff00;
    goto LAB_003a2d41;
  case 1:
    lVar4 = *(long *)(_o + 8);
    if ((*(uint *)(lVar4 + 0xb0) >> 8 & 0xff) == *puVar2) {
      return;
    }
    uVar6 = (*puVar2 & 0xff) << 8;
    uVar5 = *(uint *)(lVar4 + 0xb0) & 0xffff00ff;
LAB_003a2d41:
    *(uint *)(lVar4 + 0xb0) = uVar5 | uVar6;
    break;
  case 2:
    if (*(uint *)(*(long *)(_o + 8) + 0xb4) == *puVar2) {
      return;
    }
    *(uint *)(*(long *)(_o + 8) + 0xb4) = *puVar2;
    break;
  case 3:
    if (*(uint *)(*(long *)(_o + 8) + 0xb8) == *puVar2) {
      return;
    }
    *(uint *)(*(long *)(_o + 8) + 0xb8) = *puVar2;
    break;
  case 4:
    if (*(uint *)(*(long *)(_o + 8) + 0x160) == *puVar2) {
      return;
    }
    *(uint *)(*(long *)(_o + 8) + 0x160) = *puVar2;
    break;
  case 5:
    if (*(uint *)(*(long *)(_o + 8) + 0x164) == *puVar2) {
      return;
    }
    *(uint *)(*(long *)(_o + 8) + 0x164) = *puVar2;
  }
  (**(code **)(*(long *)_o + 0x70))(_o);
  return;
}

Assistant:

void QFormLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFormLayout *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<FieldGrowthPolicy*>(_v) = _t->fieldGrowthPolicy(); break;
        case 1: *reinterpret_cast<RowWrapPolicy*>(_v) = _t->rowWrapPolicy(); break;
        case 2: *reinterpret_cast<Qt::Alignment*>(_v) = _t->labelAlignment(); break;
        case 3: *reinterpret_cast<Qt::Alignment*>(_v) = _t->formAlignment(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->horizontalSpacing(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->verticalSpacing(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFieldGrowthPolicy(*reinterpret_cast<FieldGrowthPolicy*>(_v)); break;
        case 1: _t->setRowWrapPolicy(*reinterpret_cast<RowWrapPolicy*>(_v)); break;
        case 2: _t->setLabelAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 3: _t->setFormAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 4: _t->setHorizontalSpacing(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setVerticalSpacing(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 0: _t->resetFieldGrowthPolicy(); break;
        case 1: _t->resetRowWrapPolicy(); break;
        case 2: _t->resetLabelAlignment(); break;
        case 3: _t->resetFormAlignment(); break;
        default: break;
        }
    }
}